

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void f_luaopen(lua_State *L,void *ud)

{
  global_State *pgVar1;
  TValue *pTVar2;
  Table *pTVar3;
  Table *x_;
  
  pgVar1 = L->l_G;
  stack_init(L,L);
  pTVar3 = luaH_new(L);
  (pgVar1->l_registry).value_.gc = (GCObject *)pTVar3;
  (pgVar1->l_registry).tt_ = 'E';
  luaH_resize(L,pTVar3,2,0);
  pTVar2 = pTVar3->array;
  (pTVar2->value_).gc = (GCObject *)L;
  pTVar2->tt_ = 'H';
  pTVar2 = pTVar3->array;
  pTVar3 = luaH_new(L);
  pTVar2[1].value_.gc = (GCObject *)pTVar3;
  pTVar2[1].tt_ = 'E';
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  pgVar1->gcstp = '\0';
  (pgVar1->nilvalue).tt_ = '\0';
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  init_registry(L, g);
  luaS_init(L);
  luaT_init(L);
  luaX_init(L);
  g->gcstp = 0;  /* allow gc */
  setnilvalue(&g->nilvalue);  /* now state is complete */
  luai_userstateopen(L);
}